

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

int cJSON_GetArraySize(cJSON *array)

{
  size_t size;
  cJSON *child;
  cJSON *array_local;
  
  array_local._4_4_ = 0;
  if (array == (cJSON *)0x0) {
    array_local._4_4_ = 0;
  }
  else {
    for (size = (size_t)array->child; size != 0; size = *(size_t *)size) {
      array_local._4_4_ = array_local._4_4_ + 1;
    }
  }
  return array_local._4_4_;
}

Assistant:

CJSON_PUBLIC(int) cJSON_GetArraySize(const cJSON *array)
{
    cJSON *child = NULL;
    size_t size = 0;

    if (array == NULL)
    {
        return 0;
    }

    child = array->child;

    while(child != NULL)
    {
        size++;
        child = child->next;
    }

    /* FIXME: Can overflow here. Cannot be fixed without breaking the API */

    return (int)size;
}